

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-misc.c
# Opt level: O0

int greatest_name_match(char *name,char *filter,int res_if_none)

{
  int iVar1;
  size_t sVar2;
  size_t local_40;
  size_t filter_len;
  size_t offset;
  int res_if_none_local;
  char *filter_local;
  char *name_local;
  
  filter_len = 0;
  if (filter == (char *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = strlen(filter);
  }
  name_local._4_4_ = res_if_none;
  if (local_40 != 0) {
    if ((greatest_info.exact_name_match == '\0') || (sVar2 = strlen(name), sVar2 == local_40)) {
      for (; name[filter_len] != '\0'; filter_len = filter_len + 1) {
        if ((name[filter_len] == *filter) &&
           (iVar1 = strncmp(name + filter_len,filter,local_40), iVar1 == 0)) {
          return 1;
        }
      }
      name_local._4_4_ = 0;
    }
    else {
      name_local._4_4_ = 0;
    }
  }
  return name_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(test_example);
    RUN_TEST(calling_fread);
    RUN_TEST(calling_calloc_0_0);
    RUN_TEST(calling_malloc_0);
    RUN_TEST(calling_enum_lookup);

    GREATEST_MAIN_END(); /* display results */
}